

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *rhs1,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *rhs2)

{
  int rn;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs;
  int *ridx2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pnVar1;
  int *idx;
  Real a;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  byte bVar7;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar7 = 0;
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  (this->ssvec).setupStatus = false;
  iVar2 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx2 = (rhs2->super_IdxSet).idx;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x1c;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems[0xe] = 0;
  epsilon.m_backend.data._M_elems[0xf] = 0;
  epsilon.m_backend.data._M_elems[0x10] = 0;
  epsilon.m_backend.data._M_elems[0x11] = 0;
  epsilon.m_backend.data._M_elems[0x12] = 0;
  epsilon.m_backend.data._M_elems[0x13] = 0;
  epsilon.m_backend.data._M_elems[0x14] = 0;
  epsilon.m_backend.data._M_elems[0x15] = 0;
  epsilon.m_backend.data._M_elems[0x16] = 0;
  epsilon.m_backend.data._M_elems[0x17] = 0;
  epsilon.m_backend.data._M_elems[0x18] = 0;
  epsilon.m_backend.data._M_elems[0x19] = 0;
  epsilon.m_backend.data._M_elems._104_5_ = 0;
  epsilon.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar1 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar3 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar1; pnVar3 = pnVar3 + 1) {
    (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar3->m_backend).prec_elem = 0x1c;
    (pnVar3->m_backend).data._M_elems[0] = 0;
    (pnVar3->m_backend).data._M_elems[1] = 0;
    (pnVar3->m_backend).data._M_elems[2] = 0;
    (pnVar3->m_backend).data._M_elems[3] = 0;
    (pnVar3->m_backend).data._M_elems[4] = 0;
    (pnVar3->m_backend).data._M_elems[5] = 0;
    (pnVar3->m_backend).data._M_elems[6] = 0;
    (pnVar3->m_backend).data._M_elems[7] = 0;
    (pnVar3->m_backend).data._M_elems[8] = 0;
    (pnVar3->m_backend).data._M_elems[9] = 0;
    (pnVar3->m_backend).data._M_elems[10] = 0;
    (pnVar3->m_backend).data._M_elems[0xb] = 0;
    (pnVar3->m_backend).data._M_elems[0xc] = 0;
    (pnVar3->m_backend).data._M_elems[0xd] = 0;
    (pnVar3->m_backend).data._M_elems[0xe] = 0;
    (pnVar3->m_backend).data._M_elems[0xf] = 0;
    (pnVar3->m_backend).data._M_elems[0x10] = 0;
    (pnVar3->m_backend).data._M_elems[0x11] = 0;
    (pnVar3->m_backend).data._M_elems[0x12] = 0;
    (pnVar3->m_backend).data._M_elems[0x13] = 0;
    (pnVar3->m_backend).data._M_elems[0x14] = 0;
    (pnVar3->m_backend).data._M_elems[0x15] = 0;
    (pnVar3->m_backend).data._M_elems[0x16] = 0;
    (pnVar3->m_backend).data._M_elems[0x17] = 0;
    (pnVar3->m_backend).data._M_elems[0x18] = 0;
    (pnVar3->m_backend).data._M_elems[0x19] = 0;
    (pnVar3->m_backend).data._M_elems[0x1a] = 0;
    (pnVar3->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x6d) = 0;
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,rhs1);
  rn = (this->ssvec).super_IdxSet.num;
  pnVar5 = &epsilon;
  pnVar6 = &local_b0;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = epsilon.m_backend.exp;
  local_b0.m_backend.neg = epsilon.m_backend.neg;
  local_b0.m_backend.fpclass = epsilon.m_backend.fpclass;
  local_b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  idx = (x->super_IdxSet).idx;
  pnVar5 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  pnVar6 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  rhs2->setupStatus = false;
  iVar2 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::vSolveLeft2(&this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&local_b0,pnVar5,idx,rhs,ridx,rn,pnVar6,
                        (rhs2->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,ridx2,iVar2);
  x->setupStatus = false;
  (x->super_IdxSet).num = iVar2;
  if (0 < iVar2) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   int   rn   = rhs2.size();
   int*  ridx = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), ridx, rn);

   // this will unsetup x
   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}